

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetActiveIdUsingNavAndKeys(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  GImGui->ActiveIdUsingNavDirMask = 0xffffffff;
  pIVar1->ActiveIdUsingNavInputMask = 0xffffffff;
  ImBitArray<133,_-512>::SetAllBits((ImBitArray<133,__512> *)0x11e458);
  NavMoveRequestCancel();
  return;
}

Assistant:

void ImGui::SetActiveIdUsingNavAndKeys()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId != 0);
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask.SetAllBits();
    NavMoveRequestCancel();
}